

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O1

void Abc_DesPrint(Abc_Des_t *p)

{
  void *pvVar1;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  printf("Models of design %s:\n",p->pName);
  pVVar2 = p->vModules;
  if (0 < pVVar2->nSize) {
    uVar4 = 0;
    do {
      pvVar1 = pVVar2->pArray[uVar4];
      uVar4 = uVar4 + 1;
      printf("%2d : %20s   ",uVar4 & 0xffffffff,*(undefined8 *)((long)pvVar1 + 8));
      printf("nd = %6d   lat = %6d   whitebox = %3d   blackbox = %3d\n",
             (ulong)*(uint *)((long)pvVar1 + 0x7c),(ulong)*(uint *)((long)pvVar1 + 0x80),
             (ulong)*(uint *)((long)pvVar1 + 0x84),(ulong)*(uint *)((long)pvVar1 + 0x88));
      if (*(int *)((long)pvVar1 + 0x88) != 0) {
        lVar3 = *(long *)((long)pvVar1 + 0x50);
        if (0 < *(int *)(lVar3 + 4)) {
          lVar5 = 0;
          do {
            lVar3 = *(long *)(*(long *)(lVar3 + 8) + lVar5 * 8);
            if ((*(uint *)(lVar3 + 0x14) & 0xf) == 9) {
              printf("     %20s (whitebox)\n",*(undefined8 *)(*(long *)(lVar3 + 0x38) + 8));
            }
            lVar5 = lVar5 + 1;
            lVar3 = *(long *)((long)pvVar1 + 0x50);
          } while (lVar5 < *(int *)(lVar3 + 4));
        }
        lVar3 = *(long *)((long)pvVar1 + 0x50);
        if (0 < *(int *)(lVar3 + 4)) {
          lVar5 = 0;
          do {
            lVar3 = *(long *)(*(long *)(lVar3 + 8) + lVar5 * 8);
            if ((*(uint *)(lVar3 + 0x14) & 0xf) == 10) {
              printf("     %20s (blackbox)\n",*(undefined8 *)(*(long *)(lVar3 + 0x38) + 8));
            }
            lVar5 = lVar5 + 1;
            lVar3 = *(long *)((long)pvVar1 + 0x50);
          } while (lVar5 < *(int *)(lVar3 + 4));
        }
      }
      pVVar2 = p->vModules;
    } while ((long)uVar4 < (long)pVVar2->nSize);
  }
  return;
}

Assistant:

void Abc_DesPrint( Abc_Des_t * p )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObj;
    int i, k;
    printf( "Models of design %s:\n", p->pName );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pNtk, i )
    {
        printf( "%2d : %20s   ", i+1, pNtk->pName );
        printf( "nd = %6d   lat = %6d   whitebox = %3d   blackbox = %3d\n", 
            Abc_NtkNodeNum(pNtk), Abc_NtkLatchNum(pNtk), 
            Abc_NtkWhiteboxNum(pNtk), Abc_NtkBlackboxNum(pNtk) );
        if ( Abc_NtkBlackboxNum(pNtk) == 0 )
            continue;
        Abc_NtkForEachWhitebox( pNtk, pObj, k )
            printf( "     %20s (whitebox)\n", Abc_NtkName((Abc_Ntk_t *)pObj->pData) );
        Abc_NtkForEachBlackbox( pNtk, pObj, k )
            printf( "     %20s (blackbox)\n", Abc_NtkName((Abc_Ntk_t *)pObj->pData) );
    }
}